

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t string_last_index_of_char(pString str,char sub,size_t start,size_t count)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  
  if ((count <= start + 1) && (start <= str->len)) {
    sVar3 = 0xffffffffffffffff;
    if (count != 0) {
      if (str->len == start) {
        if (start == 0) {
          return 0xffffffffffffffff;
        }
        start = start - 1;
        count = count - 1;
      }
      lVar2 = start - count;
      for (; (pcVar1 = str->buf + start, sVar3 = 0xffffffffffffffff, str->buf + lVar2 + 1 <= pcVar1
             && (sVar3 = start, *pcVar1 != sub)); start = start - 1) {
      }
    }
    return sVar3;
  }
  puts("string_last_index_of_char: index out of range");
  exit(1);
}

Assistant:

size_t string_last_index_of_char(pString str, char sub, size_t start, size_t count)
{
    if (start + 1 < count)
    {
        log("string_last_index_of_char: index out of range");
        exit(1);
    }
    if (start > str->len)
    {
        log("string_last_index_of_char: index out of range");
        exit(1);
    }
    if (count == 0)
    {
        return STR_ERROR;
    }
    if (start == str->len)
    {
        if (str->len == 0)
        {
            return STR_ERROR;
        }
        else
        {
            start--;
            count--;
        }
    }

    char *left = str->buf + start - count + 1;
    char *right = str->buf + start - 1 + 1;
    while (left <= right)
    {
        if (*right == sub)
            return right - str->buf;
        right--;
    }
    return STR_ERROR;
}